

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

RegisterKind arm::register_type(Reg r)

{
  Reg r_local;
  undefined4 local_4;
  
  if (r < 0x10) {
    local_4 = GeneralPurpose;
  }
  else if (r < 0x30) {
    local_4 = DoubleVector;
  }
  else if (r < 0x40) {
    local_4 = QuadVector;
  }
  else if (r < 0x80000000) {
    local_4 = VirtualGeneralPurpose;
  }
  else if (r < 0xc0000000) {
    local_4 = VirtualDoubleVector;
  }
  else {
    local_4 = VirtualQuadVector;
  }
  return local_4;
}

Assistant:

RegisterKind register_type(Reg r) {
  if (r < 16)
    return RegisterKind::GeneralPurpose;
  else if (r < 48)
    return RegisterKind::DoubleVector;
  else if (r < 64)
    return RegisterKind::QuadVector;
  else if (r < 1 << 31)
    return RegisterKind::VirtualGeneralPurpose;
  else if (r < 3 << 30)
    return RegisterKind::VirtualDoubleVector;
  else
    return RegisterKind::VirtualQuadVector;
}